

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

drmp3_bool32
drmp3_calculate_seek_points(drmp3 *pMP3,drmp3_uint32 *pSeekPointCount,drmp3_seek_point *pSeekPoints)

{
  drmp3_bool32 dVar1;
  drmp3_uint32 dVar2;
  undefined8 *in_RDX;
  long lVar3;
  uint *in_RSI;
  drmp3 *in_RDI;
  drmp3_uint32 pcmFramesInCurrentMP3FrameIn_1;
  size_t i;
  drmp3_uint32 iSeekPoint;
  drmp3_uint64 nextTargetPCMFrame;
  drmp3_uint32 pcmFramesInCurrentMP3FrameIn;
  int iMP3Frame;
  float runningPCMFrameCountFractionalPart;
  drmp3_uint64 runningPCMFrameCount;
  drmp3__seeking_mp3_frame_info mp3FrameInfo [3];
  drmp3_uint64 pcmFramesBetweenSeekPoints;
  drmp3_uint64 totalPCMFrameCount;
  drmp3_uint64 totalMP3FrameCount;
  drmp3_uint64 currentPCMFrame;
  drmp3_uint32 seekPointCount;
  drmp3 *in_stack_ffffffffffffff48;
  ulong local_a8;
  uint local_9c;
  ulong local_98;
  undefined4 in_stack_ffffffffffffff78;
  int iVar4;
  float in_stack_ffffffffffffff7c;
  drmp3_uint64 *in_stack_ffffffffffffff80;
  ulong uVar5;
  undefined4 in_stack_ffffffffffffff88;
  drmp3_bool32 in_stack_ffffffffffffff8c;
  drmp3d_sample_t *in_stack_ffffffffffffff90;
  drmp3 *in_stack_ffffffffffffff98;
  short local_60;
  ulong local_40;
  ulong local_38;
  uint local_24;
  drmp3_bool32 local_4;
  
  if (((in_RDI == (drmp3 *)0x0) || (in_RSI == (uint *)0x0)) || (in_RDX == (undefined8 *)0x0)) {
    local_4 = 0;
  }
  else {
    local_24 = *in_RSI;
    if (local_24 == 0) {
      local_4 = 0;
    }
    else {
      dVar1 = drmp3_get_mp3_and_pcm_frame_count
                        ((drmp3 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         in_stack_ffffffffffffff80,
                         (drmp3_uint64 *)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      if (dVar1 == 0) {
        local_4 = 0;
      }
      else {
        if (local_38 < 3) {
          local_24 = 1;
          *in_RDX = 0;
          in_RDX[1] = 0;
          *(undefined2 *)(in_RDX + 2) = 0;
          *(undefined2 *)((long)in_RDX + 0x12) = 0;
        }
        else {
          if (local_38 - 1 < (ulong)local_24) {
            local_24 = (int)local_38 - 1;
          }
          dVar1 = drmp3_seek_to_start_of_stream(in_stack_ffffffffffffff48);
          if (dVar1 == 0) {
            return 0;
          }
          uVar5 = 0;
          for (iVar4 = 0; iVar4 < 3; iVar4 = iVar4 + 1) {
            *(drmp3_uint64 *)(&stack0xffffffffffffff88 + (long)iVar4 * 0x10) =
                 in_RDI->streamCursor - in_RDI->dataSize;
            *(ulong *)(&stack0xffffffffffffff90 + (long)iVar4 * 0x10) = uVar5;
            dVar2 = drmp3_decode_next_frame_ex
                              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                               in_stack_ffffffffffffff8c);
            if (dVar2 == 0) {
              return 0;
            }
            drmp3__accumulate_running_pcm_frame_count
                      (in_RDI,dVar2,(drmp3_uint64 *)&stack0xffffffffffffff80,
                       (float *)&stack0xffffffffffffff7c);
          }
          local_98 = 0;
          for (local_9c = 0; local_9c < local_24; local_9c = local_9c + 1) {
            local_98 = local_40 / (local_24 + 1) + local_98;
            while (uVar5 <= local_98) {
              for (local_a8 = 0; local_a8 < 2; local_a8 = local_a8 + 1) {
                lVar3 = (local_a8 + 1) * 0x10;
                *(undefined8 *)(&stack0xffffffffffffff88 + local_a8 * 0x10) =
                     *(undefined8 *)(&stack0xffffffffffffff88 + lVar3);
                *(undefined8 *)(&stack0xffffffffffffff90 + local_a8 * 0x10) =
                     *(undefined8 *)(&stack0xffffffffffffff90 + lVar3);
              }
              dVar2 = drmp3_decode_next_frame_ex
                                (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                                 in_stack_ffffffffffffff8c);
              if (dVar2 == 0) {
                in_RDX[(ulong)local_9c * 3] =
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
                in_RDX[(ulong)local_9c * 3 + 1] = local_98;
                *(undefined2 *)(in_RDX + (ulong)local_9c * 3 + 2) = 2;
                *(short *)((long)in_RDX + (ulong)local_9c * 0x18 + 0x12) =
                     (short)local_98 - local_60;
                goto LAB_00108ad7;
              }
              drmp3__accumulate_running_pcm_frame_count
                        (in_RDI,dVar2,(drmp3_uint64 *)&stack0xffffffffffffff80,
                         (float *)&stack0xffffffffffffff7c);
            }
            in_RDX[(ulong)local_9c * 3] =
                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
            in_RDX[(ulong)local_9c * 3 + 1] = local_98;
            *(undefined2 *)(in_RDX + (ulong)local_9c * 3 + 2) = 2;
            *(short *)((long)in_RDX + (ulong)local_9c * 0x18 + 0x12) = (short)local_98 - local_60;
LAB_00108ad7:
          }
          dVar1 = drmp3_seek_to_start_of_stream(in_stack_ffffffffffffff48);
          if (dVar1 == 0) {
            return 0;
          }
          dVar1 = drmp3_seek_to_pcm_frame(in_stack_ffffffffffffff48,0x108b1d);
          if (dVar1 == 0) {
            return 0;
          }
        }
        *in_RSI = local_24;
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

drmp3_bool32 drmp3_calculate_seek_points(drmp3* pMP3, drmp3_uint32* pSeekPointCount, drmp3_seek_point* pSeekPoints)
{
    if (pMP3 == NULL || pSeekPointCount == NULL || pSeekPoints == NULL) {
        return DRMP3_FALSE; // Invalid args.
    }

    drmp3_uint32 seekPointCount = *pSeekPointCount;
    if (seekPointCount == 0) {
        return DRMP3_FALSE;  // The client has requested no seek points. Consider this to be invalid arguments since the client has probably not intended this.
    }

    // We'll need to seek back to the current sample after calculating the seekpoints so we need to go ahead and grab the current location at the top.
    drmp3_uint64 currentPCMFrame = pMP3->currentPCMFrame;

    // We never do more than the total number of MP3 frames and we limit it to 32-bits.
    drmp3_uint64 totalMP3FrameCount;
    drmp3_uint64 totalPCMFrameCount;
    if (!drmp3_get_mp3_and_pcm_frame_count(pMP3, &totalMP3FrameCount, &totalPCMFrameCount)) {
        return DRMP3_FALSE;
    }

    // If there's less than DRMP3_SEEK_LEADING_MP3_FRAMES+1 frames we just report 1 seek point which will be the very start of the stream.
    if (totalMP3FrameCount < DRMP3_SEEK_LEADING_MP3_FRAMES+1) {
        seekPointCount = 1;
        pSeekPoints[0].seekPosInBytes     = 0;
        pSeekPoints[0].pcmFrameIndex      = 0;
        pSeekPoints[0].mp3FramesToDiscard = 0;
        pSeekPoints[0].pcmFramesToDiscard = 0;
    } else {
        if (seekPointCount > totalMP3FrameCount-1) {
            seekPointCount = (drmp3_uint32)totalMP3FrameCount-1;
        }

        drmp3_uint64 pcmFramesBetweenSeekPoints = totalPCMFrameCount / (seekPointCount+1);

        // Here is where we actually calculate the seek points. We need to start by moving the start of the stream. We then enumerate over each
        // MP3 frame.
        if (!drmp3_seek_to_start_of_stream(pMP3)) {
            return DRMP3_FALSE;
        }

        // We need to cache the byte positions of the previous MP3 frames. As a new MP3 frame is iterated, we cycle the byte positions in this
        // array. The value in the first item in this array is the byte position that will be reported in the next seek point.
        drmp3__seeking_mp3_frame_info mp3FrameInfo[DRMP3_SEEK_LEADING_MP3_FRAMES+1];

        drmp3_uint64 runningPCMFrameCount = 0;
        float runningPCMFrameCountFractionalPart = 0;

        // We need to initialize the array of MP3 byte positions for the leading MP3 frames.
        for (int iMP3Frame = 0; iMP3Frame < DRMP3_SEEK_LEADING_MP3_FRAMES+1; ++iMP3Frame) {
            // The byte position of the next frame will be the stream's cursor position, minus whatever is sitting in the buffer.
                    drmp3_assert(pMP3->streamCursor >= pMP3->dataSize);
            mp3FrameInfo[iMP3Frame].bytePos       = pMP3->streamCursor - pMP3->dataSize;
            mp3FrameInfo[iMP3Frame].pcmFrameIndex = runningPCMFrameCount;

            // We need to get information about this frame so we can know how many samples it contained.
            drmp3_uint32 pcmFramesInCurrentMP3FrameIn = drmp3_decode_next_frame_ex(pMP3, NULL, DRMP3_FALSE);
            if (pcmFramesInCurrentMP3FrameIn == 0) {
                return DRMP3_FALSE; // This should never happen.
            }

            drmp3__accumulate_running_pcm_frame_count(pMP3, pcmFramesInCurrentMP3FrameIn, &runningPCMFrameCount, &runningPCMFrameCountFractionalPart);
        }

        // At this point we will have extracted the byte positions of the leading MP3 frames. We can now start iterating over each seek point and
        // calculate them.
        drmp3_uint64 nextTargetPCMFrame = 0;
        for (drmp3_uint32 iSeekPoint = 0; iSeekPoint < seekPointCount; ++iSeekPoint) {
            nextTargetPCMFrame += pcmFramesBetweenSeekPoints;

            for (;;) {
                if (nextTargetPCMFrame < runningPCMFrameCount) {
                    // The next seek point is in the current MP3 frame.
                    pSeekPoints[iSeekPoint].seekPosInBytes     = mp3FrameInfo[0].bytePos;
                    pSeekPoints[iSeekPoint].pcmFrameIndex      = nextTargetPCMFrame;
                    pSeekPoints[iSeekPoint].mp3FramesToDiscard = DRMP3_SEEK_LEADING_MP3_FRAMES;
                    pSeekPoints[iSeekPoint].pcmFramesToDiscard = (drmp3_uint16)(nextTargetPCMFrame - mp3FrameInfo[DRMP3_SEEK_LEADING_MP3_FRAMES-1].pcmFrameIndex);
                    break;
                } else {
                    // The next seek point is not in the current MP3 frame, so continue on to the next one. The first thing to do is cycle the cached
                    // MP3 frame info.
                    for (size_t i = 0; i < drmp3_countof(mp3FrameInfo)-1; ++i) {
                        mp3FrameInfo[i] = mp3FrameInfo[i+1];
                    }

                    // Cache previous MP3 frame info.
                    mp3FrameInfo[drmp3_countof(mp3FrameInfo)-1].bytePos       = pMP3->streamCursor - pMP3->dataSize;
                    mp3FrameInfo[drmp3_countof(mp3FrameInfo)-1].pcmFrameIndex = runningPCMFrameCount;

                    // Go to the next MP3 frame. This shouldn't ever fail, but just in case it does we just set the seek point and break. If it happens, it
                    // should only ever do it for the last seek point.
                    drmp3_uint32 pcmFramesInCurrentMP3FrameIn = drmp3_decode_next_frame_ex(pMP3, NULL, DRMP3_TRUE);
                    if (pcmFramesInCurrentMP3FrameIn == 0) {
                        pSeekPoints[iSeekPoint].seekPosInBytes     = mp3FrameInfo[0].bytePos;
                        pSeekPoints[iSeekPoint].pcmFrameIndex      = nextTargetPCMFrame;
                        pSeekPoints[iSeekPoint].mp3FramesToDiscard = DRMP3_SEEK_LEADING_MP3_FRAMES;
                        pSeekPoints[iSeekPoint].pcmFramesToDiscard = (drmp3_uint16)(nextTargetPCMFrame - mp3FrameInfo[DRMP3_SEEK_LEADING_MP3_FRAMES-1].pcmFrameIndex);
                        break;
                    }

                    drmp3__accumulate_running_pcm_frame_count(pMP3, pcmFramesInCurrentMP3FrameIn, &runningPCMFrameCount, &runningPCMFrameCountFractionalPart);
                }
            }
        }

        // Finally, we need to seek back to where we were.
        if (!drmp3_seek_to_start_of_stream(pMP3)) {
            return DRMP3_FALSE;
        }
        if (!drmp3_seek_to_pcm_frame(pMP3, currentPCMFrame)) {
            return DRMP3_FALSE;
        }
    }

    *pSeekPointCount = seekPointCount;
    return DRMP3_TRUE;
}